

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

string_view __thiscall kratos::SystemVerilogCodeGen::indent(SystemVerilogCodeGen *this)

{
  uint32_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  string_view sVar5;
  uint local_58;
  uint32_t i;
  string local_40 [4];
  uint32_t num_indent;
  string result;
  SystemVerilogCodeGen *this_local;
  char *local_10;
  
  result.field_2._8_8_ = this;
  if ((this->skip_indent_ & 1U) == 0) {
    uVar3 = std::__cxx11::string::size();
    if (uVar3 < this->indent_ * (ulong)this->indent_size) {
      std::__cxx11::string::string(local_40);
      uVar1 = this->indent_size;
      uVar2 = this->indent_;
      std::__cxx11::string::resize((ulong)local_40);
      for (local_58 = 0; local_58 < (int)uVar2 * uVar1; local_58 = local_58 + 1) {
        puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_40);
        *puVar4 = 0x20;
      }
      std::__cxx11::string::operator=((string *)&this->empty_indent_str_,local_40);
      sVar5 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)&this->empty_indent_str_);
      this->empty_indent_string_view_ = sVar5;
      std::__cxx11::string::~string(local_40);
    }
    _this_local = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&this->empty_indent_string_view_,0,
                             this->indent_ * (ulong)this->indent_size);
  }
  else {
    this->skip_indent_ = false;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,"");
  }
  sVar5._M_len = (size_t)this_local;
  sVar5._M_str = local_10;
  return sVar5;
}

Assistant:

std::string_view SystemVerilogCodeGen::indent() {
    if (skip_indent_) {
        skip_indent_ = false;
        return "";
    }
    if (empty_indent_str_.size() < (indent_ * indent_size)) {
        // need to expand the string
        std::string result;
        uint32_t num_indent = indent_ * indent_size;
        result.resize(num_indent);
        for (uint32_t i = 0; i < num_indent; i++) result[i] = ' ';
        empty_indent_str_ = result;
        empty_indent_string_view_ = empty_indent_str_;
    }
    return empty_indent_string_view_.substr(0, indent_ * indent_size);
}